

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufUpdateArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Obj_t *pObj_00;
  float fVar2;
  int local_24;
  int Delay;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  Abc_BufCollectTfoCone(p,pObj);
  Vec_IntReverseOrder(p->vTfCone);
  for (local_24 = 0; iVar1 = Vec_IntSize(p->vTfCone), local_24 < iVar1; local_24 = local_24 + 1) {
    pNtk = p->pNtk;
    iVar1 = Vec_IntEntry(p->vTfCone,local_24);
    pObj_00 = Abc_NtkObj(pNtk,iVar1);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      fVar2 = Abc_BufComputeArr(p,pObj_00);
      iVar1 = Abc_MaxInt(p->DelayMax,(int)fVar2);
      p->DelayMax = iVar1;
    }
  }
  return;
}

Assistant:

void Abc_BufUpdateArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pNext;
    int i, Delay;
//    assert( Abc_ObjIsNode(pObj) );
    Abc_BufCollectTfoCone( p, pObj );
    Vec_IntReverseOrder( p->vTfCone );
    Abc_NtkForEachObjVec( p->vTfCone, p->pNtk, pNext, i )
    {
        Delay = Abc_BufComputeArr( p, pNext );
        p->DelayMax = Abc_MaxInt( p->DelayMax, Delay );
    }
}